

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O2

void __thiscall
llama_sbatch::add_seq_to_ubatch
          (llama_sbatch *this,llama_ubatch *ubatch,llama_sbatch_seq *seq,size_t length)

{
  vector<long,_std::allocator<long>_> *this_00;
  char cVar1;
  llama_batch *plVar2;
  llama_token *plVar3;
  pointer plVar4;
  llama_token *plVar5;
  llama_pos *plVar6;
  llama_seq_id **pplVar7;
  int8_t *piVar8;
  byte bVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  float *pfVar12;
  char *pcVar13;
  uint32_t uVar14;
  size_t i_4;
  long lVar15;
  uint32_t uVar16;
  int32_t *piVar17;
  size_t i;
  size_t sVar18;
  size_t i_1;
  size_t sVar19;
  size_t i_3;
  bool bVar20;
  undefined8 uStack_50;
  long local_38;
  
  plVar2 = this->batch;
  if (plVar2 == (llama_batch *)0x0) {
    pcVar13 = "batch != nullptr";
    uStack_50 = 0x27;
    goto LAB_001cba14;
  }
  if (seq->length < length) {
    pcVar13 = "length <= seq.length";
    uStack_50 = 0x28;
    goto LAB_001cba14;
  }
  if (((seq->n_seq_id != 0) && (ubatch->n_seqs != 0)) &&
     ((ulong)ubatch->n_tokens / (ulong)ubatch->n_seqs != length)) {
    pcVar13 = 
    "seq.n_seq_id == 0 || ubatch.n_seqs == 0 || length == (size_t) ubatch.n_tokens / ubatch.n_seqs";
    uStack_50 = 0x2b;
    goto LAB_001cba14;
  }
  bVar9 = ubatch->equal_seqs;
  if ((bool)bVar9 != (seq->n_seq_id != 0)) {
    pcVar13 = "(seq.n_seq_id != 0) == ubatch.equal_seqs";
    uStack_50 = 0x2c;
    goto LAB_001cba14;
  }
  plVar3 = plVar2->token;
  if (plVar3 == (llama_token *)0x0) {
    ubatch->token = (llama_token *)0x0;
LAB_001cb670:
    pfVar12 = plVar2->embd;
    if (pfVar12 == (float *)0x0) {
LAB_001cb6e2:
      ubatch->embd = (float *)0x0;
    }
    else {
      if ((bool)bVar9 == false) {
        sVar19 = seq->offset;
        goto LAB_001cb6ee;
      }
      for (sVar19 = 0; length != sVar19; sVar19 = sVar19 + 1) {
        sVar18 = this->n_embd;
        memcpy(ubatch->embd + (ubatch->n_tokens + sVar19) * sVar18,
               this->batch->embd +
               (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start[seq->offset + sVar19] * sVar18,sVar18 << 2);
      }
      bVar9 = ubatch->equal_seqs;
    }
  }
  else {
    if ((bool)bVar9 != false) {
      sVar19 = seq->offset;
      plVar4 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar5 = ubatch->token;
      for (sVar18 = 0; length != sVar18; sVar18 = sVar18 + 1) {
        plVar5[ubatch->n_tokens + sVar18] = plVar3[plVar4[sVar19 + sVar18]];
      }
      goto LAB_001cb670;
    }
    sVar19 = seq->offset;
    ubatch->token = plVar3 + sVar19;
    pfVar12 = plVar2->embd;
    if (pfVar12 == (float *)0x0) goto LAB_001cb6e2;
LAB_001cb6ee:
    ubatch->embd = pfVar12 + sVar19 * this->n_embd;
  }
  plVar2 = this->batch;
  sVar19 = seq->offset;
  if ((bVar9 & 1) == 0) {
    ubatch->pos = plVar2->pos + sVar19;
    plVar2 = this->batch;
    piVar17 = plVar2->n_seq_id;
    if (piVar17 == (int32_t *)0x0) {
      piVar17 = ubatch->n_seq_id;
      sVar18 = length;
      while (bVar20 = sVar18 != 0, sVar18 = sVar18 - 1, bVar20) {
        piVar17[ubatch->n_seqs] = 1;
        piVar17 = piVar17 + 1;
      }
    }
    else {
      ubatch->n_seq_id = piVar17 + sVar19;
    }
    pplVar7 = plVar2->seq_id;
    if (pplVar7 != (llama_seq_id **)0x0) {
      ubatch->seq_id = pplVar7 + sVar19;
    }
  }
  else {
    plVar4 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar6 = ubatch->pos;
    for (sVar18 = 0; length != sVar18; sVar18 = sVar18 + 1) {
      plVar6[ubatch->n_tokens + sVar18] = plVar2->pos[plVar4[sVar19 + sVar18]];
    }
    ubatch->n_seq_id[ubatch->n_seqs] = seq->n_seq_id;
    if (seq->seq_id != (llama_seq_id *)0x0) {
      ubatch->seq_id[ubatch->n_seqs] = seq->seq_id;
    }
  }
  if (this->logits_all == true) {
    lVar15 = 0;
    for (sVar19 = 0; length != sVar19; sVar19 = sVar19 + 1) {
      ubatch->output[sVar19 + ubatch->n_tokens] = '\x01';
      std::vector<long,_std::allocator<long>_>::push_back
                (&this->out_ids,
                 (value_type_conflict4 *)
                 ((long)(this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar15 + seq->offset * 8));
      lVar15 = lVar15 + 8;
    }
  }
  else {
    piVar8 = this->batch->logits;
    this_00 = &this->out_ids;
    if (piVar8 == (int8_t *)0x0) {
      for (sVar19 = 0; length != sVar19; sVar19 = sVar19 + 1) {
        plVar4 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar15 = plVar4[seq->offset + sVar19];
        bVar20 = lVar15 == ((long)(this->ids).super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)plVar4 >> 3) +
                           -1;
        ubatch->output[sVar19 + ubatch->n_tokens] = bVar20;
        if (bVar20) {
          local_38 = lVar15;
          std::vector<long,_std::allocator<long>_>::emplace_back<long>(this_00,&local_38);
        }
      }
    }
    else if ((bVar9 & 1) == 0) {
      ubatch->output = piVar8 + sVar19;
      for (sVar19 = 0; length != sVar19; sVar19 = sVar19 + 1) {
        if (ubatch->output[sVar19] != '\0') {
          local_38 = seq->offset + sVar19;
          std::vector<long,_std::allocator<long>_>::emplace_back<long>(this_00,&local_38);
        }
      }
    }
    else {
      for (sVar19 = 0; length != sVar19; sVar19 = sVar19 + 1) {
        lVar15 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start[seq->offset + sVar19];
        cVar1 = this->batch->logits[lVar15];
        ubatch->output[sVar19 + ubatch->n_tokens] = cVar1;
        if (cVar1 != '\0') {
          local_38 = lVar15;
          std::vector<long,_std::allocator<long>_>::emplace_back<long>(this_00,&local_38);
        }
      }
    }
  }
  uVar14 = (uint32_t)length;
  if (ubatch->n_tokens == 0 && ubatch->n_seqs == 0) {
    uVar16 = 1;
    if ((ubatch->equal_seqs & 1U) != 0) {
      uVar16 = uVar14;
    }
    ubatch->n_seq_tokens = uVar16;
  }
  else {
    uVar16 = ubatch->n_seq_tokens;
  }
  uVar10 = ubatch->n_tokens + uVar14;
  ubatch->n_tokens = uVar10;
  uVar11 = 1;
  if ((ubatch->equal_seqs & 1U) == 0) {
    uVar11 = uVar14;
  }
  uVar11 = uVar11 + ubatch->n_seqs;
  ubatch->n_seqs = uVar11;
  seq->offset = seq->offset + length;
  seq->length = seq->length - length;
  this->n_tokens = this->n_tokens - length;
  if (uVar10 == uVar11 * uVar16) {
    return;
  }
  pcVar13 = "ubatch.n_tokens == ubatch.n_seq_tokens * ubatch.n_seqs";
  uStack_50 = 0x89;
LAB_001cba14:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
             ,uStack_50,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

void llama_sbatch::add_seq_to_ubatch(llama_ubatch & ubatch, llama_sbatch_seq & seq, size_t length) {
    GGML_ASSERT(batch != nullptr);
    GGML_ASSERT(length <= seq.length);
    // Can only add sequences of equal lengths to a batch,
    // otherwise it isn't clear to which sequence a token belongs
    GGML_ASSERT(seq.n_seq_id == 0 || ubatch.n_seqs == 0 || length == (size_t) ubatch.n_tokens / ubatch.n_seqs);
    GGML_ASSERT((seq.n_seq_id != 0) == ubatch.equal_seqs);
    // NOTE: loops are separated for cache-friendliness
    if (batch->token) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                ubatch.token[ubatch.n_tokens + i] = batch->token[ids[seq.offset + i]];
            }
        } else {
            // simple split
            ubatch.token = batch->token + seq.offset;
        }
    } else {
        ubatch.token = nullptr;
    }
    if (batch->embd) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                memcpy(
                        ubatch.embd + (n_embd * (ubatch.n_tokens + i)),
                        batch->embd + (n_embd * ids[seq.offset + i]),
                        n_embd * sizeof(float)
                      );
            }
        } else {
            // simple split
            ubatch.embd = batch->embd + (n_embd * seq.offset);
        }
    } else {
        ubatch.embd = nullptr;
    }
    if (ubatch.equal_seqs) {
        for (size_t i = 0; i < length; ++i) {
            ubatch.pos[ubatch.n_tokens + i] = batch->pos[ids[seq.offset + i]];
        }
    } else {
        // simple split
        ubatch.pos = batch->pos + seq.offset;
    }
    if (ubatch.equal_seqs) {
        ubatch.n_seq_id[ubatch.n_seqs] = seq.n_seq_id;
        if (seq.seq_id) {
            ubatch.seq_id[ubatch.n_seqs] = seq.seq_id;
        }
    } else {
        // simple split
        if (batch->n_seq_id) {
            ubatch.n_seq_id = batch->n_seq_id + seq.offset;
        } else {
            for (size_t i = 0; i < length; ++i) {
                ubatch.n_seq_id[ubatch.n_seqs + i] = 1;
            }
        }
        if (batch->seq_id) {
            ubatch.seq_id = batch->seq_id + seq.offset;
        }
    }
    if (logits_all) {
        for (size_t i = 0; i < length; ++i) {
            ubatch.output[ubatch.n_tokens + i] = 1;
            out_ids.push_back(ids[seq.offset + i]);
        }
    } else if (batch->logits) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                size_t id = ids[seq.offset + i];
                int8_t is_output = batch->logits[id];
                ubatch.output[ubatch.n_tokens + i] = is_output;
                if (is_output) { out_ids.push_back(id); }
            }
        } else {
            // simple split
            ubatch.output = batch->logits + seq.offset;
            for (size_t i = 0; i < length; ++i) {
                if (ubatch.output[i] != 0) { out_ids.push_back(seq.offset + i); }
            }
        }
    } else {
        // only get last output
        for (size_t i = 0; i < length; ++i) {
            size_t id = ids[seq.offset + i];
            int8_t is_last = id == ids.size() - 1;
            ubatch.output[ubatch.n_tokens + i] = is_last;
            if (is_last) { out_ids.push_back(id); }
        }
    }
    if (ubatch.n_tokens == 0 && ubatch.n_seqs == 0) {
        ubatch.n_seq_tokens = ubatch.equal_seqs ? length : 1;
    }
    ubatch.n_tokens += length;
    ubatch.n_seqs += ubatch.equal_seqs ? 1 : length; // virtual sequences for simple splits
    seq.offset += length;
    seq.length -= length;
    n_tokens -= length;
    GGML_ASSERT(ubatch.n_tokens == ubatch.n_seq_tokens * ubatch.n_seqs);
}